

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_bubble_sort(int64_t *dst,size_t size)

{
  int64_t iVar1;
  int64_t _sort_swap_temp;
  size_t newn;
  size_t i;
  size_t n;
  size_t size_local;
  int64_t *dst_local;
  
  n = size;
  while (n != 0) {
    newn = 0;
    for (i = 1; i < n; i = i + 1) {
      if (0 < dst[i - 1] - dst[i]) {
        iVar1 = dst[i - 1];
        dst[i - 1] = dst[i];
        dst[i] = iVar1;
        newn = i;
      }
    }
    n = newn;
  }
  return;
}

Assistant:

void BUBBLE_SORT(SORT_TYPE *dst, const size_t size) {
  size_t n = size;

  while (n) {
    size_t i, newn = 0U;

    for (i = 1U; i < n; ++i) {
      if (SORT_CMP(dst[i - 1U], dst[i]) > 0) {
        SORT_SWAP(dst[i - 1U], dst[i]);
        newn = i;
      }
    }

    n = newn;
  }
}